

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSyncTests.cpp
# Opt level: O1

void __thiscall deqp::gles3::Stress::FenceSyncCase::deinit(FenceSyncCase *this)

{
  ShaderProgram *this_00;
  pointer pp_Var1;
  pointer pp_Var2;
  pointer pp_Var3;
  long lVar4;
  
  this_00 = this->m_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
    this->m_program = (ShaderProgram *)0x0;
  }
  pp_Var2 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pp_Var3 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)pp_Var3 - (long)pp_Var2) >> 3)) {
    lVar4 = 0;
    do {
      if (pp_Var2[lVar4] != (GLsync)0x0) {
        glwDeleteSync(pp_Var2[lVar4]);
      }
      lVar4 = lVar4 + 1;
      pp_Var2 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pp_Var3 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)pp_Var3 - (long)pp_Var2) >> 3));
  }
  if ((pp_Var2 != pp_Var3) &&
     (pp_Var1 = (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
     pp_Var2 = (pointer)((long)pp_Var2 + ((long)pp_Var1 - (long)pp_Var3)), pp_Var1 != pp_Var2)) {
    (this->m_syncObjects).super__Vector_base<__GLsync_*,_std::allocator<__GLsync_*>_>._M_impl.
    super__Vector_impl_data._M_finish = pp_Var2;
  }
  return;
}

Assistant:

void FenceSyncCase::deinit (void)
{
	if (m_program)
	{
		delete m_program;
		m_program = DE_NULL;
	}

	for (int i = 0; i < (int)m_syncObjects.size(); i++)
		if (m_syncObjects[i])
			glDeleteSync(m_syncObjects[i]);

	m_syncObjects.erase(m_syncObjects.begin(), m_syncObjects.end());
}